

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.h
# Opt level: O2

int tcmalloc::CreateTlsKey(TlsKey *pkey,_func_void_void_ptr *destructor)

{
  int iVar1;
  
  do {
    iVar1 = pthread_key_create(pkey,(__destr_function *)destructor);
    if (iVar1 != 0) {
      return iVar1;
    }
  } while (*pkey == 0xffffffff);
  return 0;
}

Assistant:

ATTRIBUTE_VISIBILITY_HIDDEN inline int CreateTlsKey(TlsKey *pkey, void (*destructor)(void*)) {
  int err = pthread_key_create(pkey, destructor);
  if (err != 0) {
    return err;
  }
  // It is super-implausible that we'll be able to create "invalid"
  // tls key value, but just in case, we check and re-create if we end
  // up getting one.
  if (*pkey != kInvalidTLSKey) {
    return 0;
  }

  return CreateTlsKey(pkey, destructor);
}